

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

CNetAddr * ResolveIP(string *ip)

{
  long lVar1;
  undefined1 uVar2;
  DNSLookupFn *in_RSI;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  optional<CNetAddr> addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  CNetAddr *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CNetAddr *file;
  string *in_stack_fffffffffffffee8;
  const_string local_f8;
  lazy_ostream local_e8 [2];
  assertion_result local_c8 [2];
  undefined1 local_90 [56];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (undefined1)((ulong)local_90 >> 0x38);
  file = in_RDI;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(in_stack_fffffffffffffeb8,
             (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  LookupHost(in_stack_fffffffffffffee8,(bool)uVar2,in_RSI);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)in_stack_fffffffffffffe98);
  do {
    args = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffea8,
               (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (unsigned_long)in_stack_fffffffffffffe98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_RSI,(const_string *)file,(size_t)in_RDI,(const_string *)args);
    std::optional<CNetAddr>::has_value((optional<CNetAddr> *)in_stack_fffffffffffffe98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffea8,(bool)in_stack_fffffffffffffea7);
    boost::unit_test::lazy_ostream::instance();
    tinyformat::format<std::__cxx11::string>((char *)in_RDI,args);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffea8,
               (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (unsigned_long)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe98 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_c8,local_e8,&local_f8,0x26,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(in_stack_fffffffffffffe98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe98);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  CNetAddr::CNetAddr((CNetAddr *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  std::optional<CNetAddr>::value_or<CNetAddr>
            ((optional<CNetAddr> *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffffe98);
  std::optional<CNetAddr>::~optional((optional<CNetAddr> *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return file;
  }
  __stack_chk_fail();
}

Assistant:

static CNetAddr ResolveIP(const std::string& ip)
{
    const std::optional<CNetAddr> addr{LookupHost(ip, false)};
    BOOST_CHECK_MESSAGE(addr.has_value(), strprintf("failed to resolve: %s", ip));
    return addr.value_or(CNetAddr{});
}